

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_value.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::ArrayValueStats(ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this;
  size_type sVar1;
  long *in_RDX;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  idx_t i;
  BaseStatistics *list_child_stats;
  BaseStatistics list_stats;
  BoundFunctionExpression *expr;
  vector<duckdb::BaseStatistics,_true> *child_stats;
  size_type in_stack_ffffffffffffff08;
  vector<duckdb::BaseStatistics,_true> *pvVar2;
  ulong local_b8;
  LogicalType local_98 [24];
  BaseStatistics local_80 [88];
  long local_28;
  vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *local_20;
  
  local_20 = (vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)in_RDX[2];
  local_28 = *in_RDX;
  duckdb::LogicalType::LogicalType(local_98,(LogicalType *)(local_28 + 0x38));
  duckdb::ArrayStats::CreateEmpty(local_80,local_98);
  duckdb::LogicalType::~LogicalType(local_98);
  this = (vector<duckdb::BaseStatistics,_true> *)duckdb::ArrayStats::GetChildStats(local_80);
  local_b8 = 0;
  while( true ) {
    sVar1 = std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::size
                      (local_20);
    if (sVar1 <= local_b8) break;
    pvVar2 = this;
    vector<duckdb::BaseStatistics,_true>::operator[](this,in_stack_ffffffffffffff08);
    duckdb::BaseStatistics::Merge((BaseStatistics *)pvVar2);
    local_b8 = local_b8 + 1;
  }
  duckdb::BaseStatistics::ToUnique();
  duckdb::BaseStatistics::~BaseStatistics(local_80);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> ArrayValueStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto list_stats = ArrayStats::CreateEmpty(expr.return_type);
	auto &list_child_stats = ArrayStats::GetChildStats(list_stats);
	for (idx_t i = 0; i < child_stats.size(); i++) {
		list_child_stats.Merge(child_stats[i]);
	}
	return list_stats.ToUnique();
}